

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase268::run(TestCase268 *this)

{
  uint uVar1;
  bool bVar2;
  Thread *this_00;
  long lVar3;
  long lVar4;
  int iVar5;
  DebugExpression<bool> _kjCondition_10;
  undefined3 uStack_5db;
  MutexGuarded<unsigned_int> value;
  anon_class_1_0_00000001 local_5b3;
  undefined1 local_5b2;
  undefined1 local_5b1 [9];
  uint m;
  undefined4 uStack_5a4;
  Maybe<kj::_::Mutex::Waiter_&> local_5a0;
  Waiter *local_598;
  Thread thread_1;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  PredicateImpl impl;
  undefined8 local_528;
  undefined8 local_520;
  uint m_1;
  undefined4 uStack_3bc;
  undefined1 *local_3b8;
  Waiter *local_3b0;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_3a8;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_398;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_388;
  Locked<unsigned_int> lock;
  Thread thread;
  
  local_5b1._1_8_ = systemPreciseMonotonicClock();
  _::Mutex::Mutex(&value.mutex);
  value.value = 0x7b;
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d128;
  impl.condition = (anon_class_1_0_00000001 *)&m_1;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = (unsigned_long_long)&DAT_2540be400;
  _::Mutex::wait(lock.mutex,&impl);
  iVar5 = value.value + 3;
  value.value = value.value + 1;
  Locked<unsigned_int>::~Locked(&lock);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&m;
  _m = (undefined **)CONCAT44(uStack_5a4,iVar5);
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x7e);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if ((iVar5 != 0x7e) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x118,ERROR,"\"failed: expected \" \"m == 126\", _kjCondition",
               (char (*) [26])"failed: expected m == 126",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)&thread,&value);
  iVar5 = *(int *)thread.threadId;
  impl.super_Predicate._vptr_Predicate = (_func_int **)thread.threadId;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x7c);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)&thread);
  if ((iVar5 != 0x7c) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x11a,ERROR,"\"failed: expected \" \"*value.lockShared() == 124\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 124",
               (DebugComparison<const_unsigned_int_&,_int> *)&impl);
  }
  local_388.ptr = (Iface *)operator_new(0x10);
  (local_388.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021d158;
  local_388.ptr[1]._vptr_Iface = (_func_int **)&value;
  local_388.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_2>>
        ::instance;
  Thread::Thread(&thread,(Function<void_()> *)&local_388);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_388);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&m,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d1c0;
  impl.condition = (anon_class_1_0_00000001 *)&thread_1;
  impl.value = (uint *)local_5a0.ptr;
  lock.mutex = (Mutex *)CONCAT71(lock.mutex._1_7_,1);
  lock.ptr = (uint *)&DAT_2540be400;
  _::Mutex::wait((Mutex *)_m,&impl);
  iVar5 = value.value + 3;
  value.value = value.value + 1;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&m);
  _m_1 = (undefined **)CONCAT44(uStack_3bc,iVar5);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&m_1;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x144);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if ((iVar5 != 0x144) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x127,ERROR,"\"failed: expected \" \"m == 324\", _kjCondition",
               (char (*) [26])"failed: expected m == 324",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)&lock,&value);
  uVar1 = *lock.ptr;
  impl.super_Predicate._vptr_Predicate = (_func_int **)lock.ptr;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x142);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)&lock);
  if ((uVar1 != 0x142) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x129,ERROR,"\"failed: expected \" \"*value.lockShared() == 322\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 322",
               (DebugComparison<const_unsigned_int_&,_int> *)&impl);
  }
  Thread::~Thread(&thread);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&impl,&value);
  *(undefined4 *)impl.condition = 0;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&impl);
  thread.state = (ThreadState *)
                 _::HeapArrayDisposer::allocateUninitialized<kj::Own<kj::Thread,decltype(nullptr)>>
                           (100);
  thread._16_8_ = (long)&thread.state[3].exception.ptr.field_1 + 0xd8;
  thread.threadId = (unsigned_long_long)thread.state;
  for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
    this_00 = (Thread *)operator_new(0x18);
    impl.condition = (anon_class_1_0_00000001 *)operator_new(0x18);
    *(undefined ***)impl.condition = &PTR_operator___0021d1f0;
    *(int *)(impl.condition + 8) = iVar5;
    *(MutexGuarded<unsigned_int> **)(impl.condition + 0x10) = &value;
    impl.super_Predicate._vptr_Predicate =
         (_func_int **)
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_5>>
          ::instance;
    Thread::Thread(this_00,(Function<void_()> *)&impl);
    Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<void_()>::Iface,_std::nullptr_t> *)&impl);
    *(undefined8 **)thread.threadId = &_::HeapDisposer<kj::Thread>::instance;
    *(Thread **)(thread.threadId + 8) = this_00;
    thread.threadId = thread.threadId + 0x10;
  }
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&m,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d288;
  impl.condition = (anon_class_1_0_00000001 *)&thread_1;
  impl.value = (uint *)local_5a0.ptr;
  lock.mutex = (Mutex *)CONCAT71(lock.mutex._1_7_,1);
  lock.ptr = (uint *)&DAT_2540be400;
  _::Mutex::wait((Mutex *)_m,&impl);
  uVar1 = value.value;
  value.value = value.value + 1;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&m);
  _m_1 = (undefined **)CONCAT44(uStack_3bc,uVar1);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&m_1;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,100);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if ((uVar1 != 100) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13d,ERROR,"\"failed: expected \" \"m == 100\", _kjCondition",
               (char (*) [26])"failed: expected m == 100",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  MutexGuarded<unsigned_int>::lockShared((MutexGuarded<unsigned_int> *)&lock,&value);
  uVar1 = *lock.ptr;
  impl.super_Predicate._vptr_Predicate = (_func_int **)lock.ptr;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x65);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  Locked<const_unsigned_int>::~Locked((Locked<const_unsigned_int> *)&lock);
  if ((uVar1 != 0x65) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"*value.lockShared() == 101\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 101",
               (DebugComparison<const_unsigned_int_&,_int> *)&impl);
  }
  ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_>::dispose
            ((ArrayBuilder<kj::Own<kj::Thread,_std::nullptr_t>_> *)&thread);
  lVar3 = (*(code *)**(undefined8 **)local_5b1._1_8_)();
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d2b8;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = 10000000;
  impl.condition = (anon_class_1_0_00000001 *)&m;
  _::Mutex::wait(lock.mutex,(DebugComparison<unsigned_int_&,_int> *)&impl);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&value.value;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x65);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if (value.value != 0x65) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)&thread,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x145,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
    _::Debug::Fault::fatal((Fault *)&thread);
  }
  lVar4 = (*(code *)**(undefined8 **)local_5b1._1_8_)();
  thread.state = (ThreadState *)(lVar4 - lVar3);
  impl.condition = (anon_class_1_0_00000001 *)0x989680;
  impl.value = (uint *)anon_var_dwarf_1dba4d;
  impl.super_Predicate._vptr_Predicate = (_func_int **)&thread;
  if (((long)thread.state < 10000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x147,ERROR,"\"failed: expected \" \"t >= 10 * kj::MILLISECONDS\", _kjCondition, t",
               (char (*) [44])"failed: expected t >= 10 * kj::MILLISECONDS",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)&impl,(Quantity<long,_kj::_::NanosecondLabel> *)&thread);
  }
  Locked<unsigned_int>::~Locked(&lock);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d2e8;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = 10000000;
  impl.condition = (anon_class_1_0_00000001 *)&m;
  _::Mutex::wait(lock.mutex,(DebugComparison<unsigned_int_&,_int> *)&impl);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&value.value;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x65);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if (value.value != 0x65) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)&thread,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x14d,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
    _::Debug::Fault::fatal((Fault *)&thread);
  }
  lVar4 = (*(code *)**(undefined8 **)local_5b1._1_8_)();
  thread.state = (ThreadState *)(lVar4 - lVar3);
  impl.condition = (anon_class_1_0_00000001 *)0x1312d00;
  impl.value = (uint *)anon_var_dwarf_1dba4d;
  impl.super_Predicate._vptr_Predicate = (_func_int **)&thread;
  if (((long)thread.state < 20000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x14f,ERROR,"\"failed: expected \" \"t >= 20 * kj::MILLISECONDS\", _kjCondition, t",
               (char (*) [44])"failed: expected t >= 20 * kj::MILLISECONDS",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)&impl,(Quantity<long,_kj::_::NanosecondLabel> *)&thread);
  }
  Locked<unsigned_int>::~Locked(&lock);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d318;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = (unsigned_long_long)&DAT_2540be400;
  impl.condition = (anon_class_1_0_00000001 *)&m;
  _::Mutex::wait(lock.mutex,(DebugComparison<unsigned_int_&,_int> *)&impl);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&value.value;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x65);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  if (value.value != 0x65) {
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)&thread,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x155,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
    _::Debug::Fault::fatal((Fault *)&thread);
  }
  Locked<unsigned_int>::~Locked(&lock);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)local_578,&value);
  _m_1 = &PTR_check_0021d348;
  local_3b8 = &local_5b2;
  local_3b0 = (Waiter *)local_578._8_8_;
  _::Mutex::wait((Mutex *)local_578._0_8_,&m_1);
  if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x160,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
  }
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)local_578);
  thread.state = (ThreadState *)((ulong)thread.state & 0xffffffffffffff00);
  _::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&impl,(NullableValue<kj::Exception> *)&thread);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&thread);
  if ((char)impl.super_Predicate._vptr_Predicate == '\x01') {
    thread.state = (ThreadState *)local_528;
    if (local_520 == 0) {
      thread.state = (ThreadState *)0x1cf111;
    }
    thread.threadId = local_520 + (ulong)(local_520 == 0);
    lock.mutex = (Mutex *)anon_var_dwarf_1dd322;
    lock.ptr = (uint *)0xb;
    bVar2 = StringPtr::contains((StringPtr *)&thread,(StringPtr *)&lock);
    _m = (undefined **)CONCAT71(stack0xfffffffffffffa59,bVar2);
    if (_::Debug::minSeverity < 3 && !bVar2) {
      _::Debug::
      log<char_const(&)[59],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x161,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"oops threw\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [59])"failed: expected e.getDescription().contains(\"oops threw\")",
                 (DebugExpression<bool> *)&m,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (Exception *)&impl.condition);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[154]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x161,ERROR,
               "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\\\"oops threw\\\"); }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
               ,(char (*) [154])
                "code did not throw: value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\"oops threw\"); }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
              );
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&impl);
  local_398.ptr = (Iface *)operator_new(0x10);
  (local_398.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021d378;
  local_398.ptr[1]._vptr_Iface = (_func_int **)&value;
  local_398.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_15>>
        ::instance;
  Thread::Thread(&thread_1,(Function<void_()> *)&local_398);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_398);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)local_568,&value);
  _m = &PTR_check_0021d3e0;
  local_5a0.ptr = (Waiter *)local_5b1;
  local_598 = (Waiter *)local_568._8_8_;
  _::Mutex::wait((Mutex *)local_568._0_8_,&m);
  if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x16d,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
  }
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)local_568);
  thread.state = (ThreadState *)((ulong)thread.state & 0xffffffffffffff00);
  _::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)&impl,(NullableValue<kj::Exception> *)&thread);
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&thread);
  if ((char)impl.super_Predicate._vptr_Predicate == '\x01') {
    if (local_520 == 0) {
      local_528 = "";
    }
    thread.threadId = local_520 + (ulong)(local_520 == 0);
    lock.mutex = (Mutex *)anon_var_dwarf_1dd322;
    lock.ptr = (uint *)0xb;
    thread.state = (ThreadState *)local_528;
    bVar2 = StringPtr::contains((StringPtr *)&thread,(StringPtr *)&lock);
    __kjCondition_10 = CONCAT31(uStack_5db,bVar2);
    if (_::Debug::minSeverity < 3 && !bVar2) {
      _::Debug::
      log<char_const(&)[59],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"oops threw\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [59])"failed: expected e.getDescription().contains(\"oops threw\")",
                 &_kjCondition_10,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 (Exception *)&impl.condition);
    }
  }
  else if (_::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[173]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x16e,ERROR,
               "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \\\"oops threw\\\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
               ,(char (*) [173])
                "code did not throw: value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \"oops threw\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
              );
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&impl);
  Thread::~Thread(&thread_1);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d410;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = (unsigned_long_long)&DAT_2540be400;
  impl.condition = (anon_class_1_0_00000001 *)&thread_1;
  _::Mutex::wait(lock.mutex,&impl);
  uVar1 = value.value;
  Locked<unsigned_int>::~Locked(&lock);
  __kjCondition_10 = uVar1;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x141);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  impl.super_Predicate._vptr_Predicate = (_func_int **)&_kjCondition_10;
  if ((uVar1 != 0x141) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x176,ERROR,"\"failed: expected \" \"m == 321\", _kjCondition",
               (char (*) [26])"failed: expected m == 321",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  lVar3 = (*(code *)**(undefined8 **)local_5b1._1_8_)();
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&lock,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d440;
  impl.value = lock.ptr;
  thread.state = (ThreadState *)CONCAT71(thread.state._1_7_,1);
  thread.threadId = 10000000;
  impl.condition = (anon_class_1_0_00000001 *)&thread_1;
  _::Mutex::wait(lock.mutex,&impl);
  lVar4 = (*(code *)**(undefined8 **)local_5b1._1_8_)();
  impl.super_Predicate._vptr_Predicate = (_func_int **)(lVar4 - lVar3);
  impl.condition = (anon_class_1_0_00000001 *)0x989680;
  impl.value = (uint *)anon_var_dwarf_1dba4d;
  if (((long)impl.super_Predicate._vptr_Predicate < 10000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>,kj::Quantity<long,kj::_::NanosecondLabel>>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x17a,ERROR,
               "\"failed: expected \" \"clock.now() - start >= 10 * kj::MILLISECONDS\", _kjCondition"
               ,(char (*) [62])"failed: expected clock.now() - start >= 10 * kj::MILLISECONDS",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)&impl);
  }
  iVar5 = value.value + 1;
  Locked<unsigned_int>::~Locked(&lock);
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x142);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  __kjCondition_10 = iVar5;
  impl.super_Predicate._vptr_Predicate = (_func_int **)&_kjCondition_10;
  if ((iVar5 != 0x142) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x17d,ERROR,"\"failed: expected \" \"m == 322\", _kjCondition",
               (char (*) [26])"failed: expected m == 322",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  local_3a8.ptr = (Iface *)operator_new(0x10);
  (local_3a8.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0021d470;
  local_3a8.ptr[1]._vptr_Iface = (_func_int **)&value;
  local_3a8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_21>>
        ::instance;
  Thread::Thread(&thread,(Function<void_()> *)&local_3a8);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_3a8);
  MutexGuarded<unsigned_int>::lockExclusive((MutexGuarded<unsigned_int> *)&thread_1,&value);
  impl.super_Predicate._vptr_Predicate = (_func_int **)&PTR_check_0021d4d8;
  impl.condition = &local_5b3;
  impl.value = (uint *)thread_1.threadId;
  lock.mutex = (Mutex *)CONCAT71(lock.mutex._1_7_,1);
  lock.ptr = (uint *)&DAT_2540be400;
  _::Mutex::wait((Mutex *)thread_1.state,&impl);
  uVar1 = value.value;
  Locked<unsigned_int>::~Locked((Locked<unsigned_int> *)&thread_1);
  __kjCondition_10 = uVar1;
  impl.condition = (anon_class_1_0_00000001 *)CONCAT44(impl.condition._4_4_,0x28e);
  impl.value = (uint *)anon_var_dwarf_1b07e;
  impl.super_Predicate._vptr_Predicate = (_func_int **)&_kjCondition_10;
  if ((uVar1 != 0x28e) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x187,ERROR,"\"failed: expected \" \"m == 654\", _kjCondition",
               (char (*) [26])"failed: expected m == 654",
               (DebugComparison<unsigned_int_&,_int> *)&impl);
  }
  Thread::~Thread(&thread);
  _::Mutex::~Mutex(&value.mutex);
  return;
}

Assistant:

TEST(Mutex, WhenWithTimeout) {
  auto& clock = systemPreciseMonotonicClock();
  MutexGuarded<uint> value(123);

  // A timeout that won't expire.
  static constexpr Duration LONG_TIMEOUT = 10 * kj::SECONDS;

  {
    uint m = value.when([](uint n) { return n < 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 126);

    KJ_EXPECT(*value.lockShared() == 124);
  }

  {
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    uint m = value.when([](uint n) { return n > 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 324);

    KJ_EXPECT(*value.lockShared() == 322);
  }

  {
    // Stress test. 100 threads each wait for a value and then set the next value.
    *value.lockExclusive() = 0;

    auto threads = kj::heapArrayBuilder<kj::Own<kj::Thread>>(100);
    for (auto i: kj::zeroTo(100)) {
      threads.add(kj::heap<kj::Thread>([i,&value]() {
        if (i % 2 == 0) delay();
        uint m = value.when([i](const uint& n) { return n == i; },
            [](uint& n) { return n++; }, LONG_TIMEOUT);
        KJ_ASSERT(m == i);
      }));
    }

    uint m = value.when([](uint n) { return n == 100; }, [](uint& n) {
      return n++;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 100);

    KJ_EXPECT(*value.lockShared() == 101);
  }

  {
    auto start = clock.now();
    uint m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 10 * kj::MILLISECONDS, t);
      return 12;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 12);

    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 20 * kj::MILLISECONDS, t);
      return 34;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 34);

    m = value.when([](uint n) { return n > 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      return 56;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 56);
  }

  {
    // Throw from predicate.
    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_FAIL_ASSERT("oops threw");
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));

    // Throw from predicate later on.
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_ASSERT(n != 321, "oops threw");
      return false;
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));
  }

  {
    // Verify the exceptions didn't break the mutex.
    uint m = value.when([](uint n) { return n > 0; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 321);

    auto start = clock.now();
    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_EXPECT(clock.now() - start >= 10 * kj::MILLISECONDS);
      return n + 1;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 322);

    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 654;
    });

    m = value.when([](uint n) { return n > 500; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 654);
  }
}